

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O3

int json_serialize_to_buffer_r
              (JSON_Value *value,char *buf,int level,parson_bool_t is_pretty,char *num_buf)

{
  JSON_Array *pJVar1;
  JSON_Object *pJVar2;
  int iVar3;
  uint uVar4;
  size_t sVar5;
  size_t len;
  parson_bool_t pVar6;
  char *pcVar7;
  int iVar8;
  bool bVar9;
  JSON_Value *pJVar10;
  ulong uVar11;
  char *pcVar12;
  bool bVar13;
  
  if (value == (JSON_Value *)0x0) {
    return -1;
  }
  iVar8 = -1;
  switch(value->type) {
  case 1:
    if (buf == (char *)0x0) {
      return 4;
    }
    builtin_strncpy(buf,"null",4);
    goto LAB_001796fd;
  case 2:
    pcVar7 = (value->value).string.chars;
    if ((pcVar7 != (char *)0x0) &&
       (iVar8 = json_serialize_string(pcVar7,(value->value).string.length,buf), iVar8 < 0)) {
      iVar8 = -1;
    }
    break;
  case 3:
    if (buf != (char *)0x0) {
      num_buf = buf;
    }
    if (parson_number_serialization_function == (JSON_Number_Serialization_Function)0x0) {
      pcVar7 = parson_float_format;
      if (parson_float_format == (char *)0x0) {
        pcVar7 = "%1.17g";
      }
      iVar3 = sprintf(num_buf,pcVar7);
    }
    else {
      iVar3 = (*parson_number_serialization_function)((value->value).number,num_buf);
    }
    iVar8 = -1;
    if (-1 < iVar3) {
      iVar8 = iVar3;
    }
    break;
  case 4:
    pJVar2 = (value->value).object;
    if (pJVar2 == (JSON_Object *)0x0) {
      sVar5 = 0;
    }
    else {
      sVar5 = pJVar2->count;
    }
    if (buf == (char *)0x0) {
      bVar13 = is_pretty != 0;
      bVar9 = sVar5 != 0 && bVar13;
      iVar8 = bVar9 + 1;
      pcVar7 = (char *)0x0;
LAB_00179954:
      if (sVar5 != 0) goto LAB_0017995d;
    }
    else {
      buf[0] = '{';
      buf[1] = '\0';
      pcVar7 = buf + 1;
      bVar9 = false;
      iVar8 = 1;
      bVar13 = is_pretty != 0;
      if ((is_pretty == 0) || (sVar5 == 0)) goto LAB_00179954;
      buf[1] = '\n';
      buf[2] = '\0';
      pcVar7 = buf + 2;
      bVar13 = true;
      iVar8 = 2;
      bVar9 = true;
LAB_0017995d:
      if (pJVar2 == (JSON_Object *)0x0) {
        return -1;
      }
      uVar11 = 0;
      do {
        if ((pJVar2->count <= uVar11) || (pcVar12 = pJVar2->names[uVar11], pcVar12 == (char *)0x0))
        {
          return -1;
        }
        iVar3 = level + 1;
        if ((bool)(-1 < level & bVar13)) {
          do {
            if (pcVar7 == (char *)0x0) {
              pcVar7 = (char *)0x0;
            }
            else {
              builtin_strncpy(pcVar7,"    ",5);
              pcVar7 = pcVar7 + 4;
            }
            iVar3 = iVar3 + -1;
          } while (iVar3 != 0);
          iVar8 = iVar8 + level * 4 + 4;
        }
        len = strlen(pcVar12);
        uVar4 = json_serialize_string(pcVar12,len,pcVar7);
        if ((int)uVar4 < 0) {
          return -1;
        }
        if (pcVar7 == (char *)0x0) {
          pcVar12 = (char *)0x0;
          if (bVar13) goto LAB_00179a3b;
LAB_00179a54:
          if (uVar11 < pJVar2->count) {
            pJVar10 = pJVar2->values[uVar11];
          }
          else {
            pJVar10 = (JSON_Value *)0x0;
          }
          iVar8 = iVar8 + uVar4 + 1;
          pVar6 = 0;
        }
        else {
          (pcVar7 + uVar4)[0] = ':';
          (pcVar7 + uVar4)[1] = '\0';
          if (!bVar13) {
            pcVar12 = pcVar7 + (ulong)uVar4 + 1;
            goto LAB_00179a54;
          }
          (pcVar7 + (ulong)uVar4 + 1)[0] = ' ';
          (pcVar7 + (ulong)uVar4 + 1)[1] = '\0';
          pcVar12 = pcVar7 + (ulong)uVar4 + 2;
LAB_00179a3b:
          if (uVar11 < pJVar2->count) {
            pJVar10 = pJVar2->values[uVar11];
          }
          else {
            pJVar10 = (JSON_Value *)0x0;
          }
          iVar8 = iVar8 + uVar4 + 2;
          pVar6 = 1;
        }
        uVar4 = json_serialize_to_buffer_r(pJVar10,pcVar12,level + 1,pVar6,num_buf);
        if ((int)uVar4 < 0) {
          return -1;
        }
        pcVar7 = pcVar12 + uVar4;
        if (pcVar12 == (char *)0x0) {
          pcVar7 = (char *)0x0;
        }
        iVar8 = iVar8 + uVar4;
        if (uVar11 < sVar5 - 1) {
          if (pcVar7 == (char *)0x0) {
            pcVar7 = (char *)0x0;
          }
          else {
            pcVar7[0] = ',';
            pcVar7[1] = '\0';
            pcVar7 = pcVar7 + 1;
          }
          iVar8 = iVar8 + 1;
        }
        if (bVar13) {
          if (pcVar7 == (char *)0x0) {
            pcVar7 = (char *)0x0;
          }
          else {
            pcVar7[0] = '\n';
            pcVar7[1] = '\0';
            pcVar7 = pcVar7 + 1;
          }
          iVar8 = iVar8 + 1;
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 != sVar5);
    }
    if (bVar9 && 0 < level) {
      iVar3 = level * 4;
      do {
        if (pcVar7 == (char *)0x0) {
          pcVar7 = (char *)0x0;
        }
        else {
          builtin_strncpy(pcVar7,"    ",5);
          pcVar7 = pcVar7 + 4;
        }
        level = level + -1;
      } while (level != 0);
      iVar8 = iVar8 + iVar3;
    }
    if (pcVar7 != (char *)0x0) {
      pcVar7[0] = '}';
      pcVar7[1] = '\0';
    }
    goto LAB_00179b33;
  case 5:
    pJVar1 = (value->value).array;
    if (pJVar1 == (JSON_Array *)0x0) {
      sVar5 = 0;
    }
    else {
      sVar5 = pJVar1->count;
    }
    if (buf == (char *)0x0) {
      bVar13 = is_pretty != 0;
      bVar9 = sVar5 != 0 && bVar13;
      iVar8 = bVar9 + 1;
      pcVar7 = (char *)0x0;
LAB_00179762:
      if (sVar5 != 0) goto LAB_0017976b;
    }
    else {
      buf[0] = '[';
      buf[1] = '\0';
      pcVar7 = buf + 1;
      bVar9 = false;
      iVar8 = 1;
      bVar13 = is_pretty != 0;
      if ((is_pretty == 0) || (sVar5 == 0)) goto LAB_00179762;
      buf[1] = '\n';
      buf[2] = '\0';
      pcVar7 = buf + 2;
      bVar13 = true;
      iVar8 = 2;
      bVar9 = true;
LAB_0017976b:
      uVar11 = 0;
      do {
        if (bVar13) {
          iVar3 = level + 1;
          if (-1 < level) {
            do {
              if (pcVar7 == (char *)0x0) {
                pcVar7 = (char *)0x0;
              }
              else {
                builtin_strncpy(pcVar7,"    ",5);
                pcVar7 = pcVar7 + 4;
              }
              iVar3 = iVar3 + -1;
            } while (iVar3 != 0);
            iVar8 = iVar8 + level * 4 + 4;
          }
          if ((pJVar1 == (JSON_Array *)0x0) || (pJVar1->count <= uVar11)) {
            pJVar10 = (JSON_Value *)0x0;
          }
          else {
            pJVar10 = pJVar1->items[uVar11];
          }
          pVar6 = 1;
          pcVar12 = pcVar7;
        }
        else {
          if ((pJVar1 == (JSON_Array *)0x0) || (pJVar1->count <= uVar11)) {
            pJVar10 = (JSON_Value *)0x0;
          }
          else {
            pJVar10 = pJVar1->items[uVar11];
          }
          pVar6 = 0;
          pcVar12 = pcVar7;
        }
        uVar4 = json_serialize_to_buffer_r(pJVar10,pcVar12,level + 1,pVar6,num_buf);
        if ((int)uVar4 < 0) {
          return -1;
        }
        pcVar7 = pcVar12 + uVar4;
        if (pcVar12 == (char *)0x0) {
          pcVar7 = pcVar12;
        }
        iVar8 = iVar8 + uVar4;
        if (uVar11 < sVar5 - 1) {
          if (pcVar7 == (char *)0x0) {
            pcVar7 = (char *)0x0;
          }
          else {
            pcVar7[0] = ',';
            pcVar7[1] = '\0';
            pcVar7 = pcVar7 + 1;
          }
          iVar8 = iVar8 + 1;
        }
        if (bVar13) {
          if (pcVar7 == (char *)0x0) {
            pcVar7 = (char *)0x0;
          }
          else {
            pcVar7[0] = '\n';
            pcVar7[1] = '\0';
            pcVar7 = pcVar7 + 1;
          }
          iVar8 = iVar8 + 1;
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 != sVar5);
    }
    if (bVar9 && 0 < level) {
      iVar3 = level * 4;
      do {
        if (pcVar7 == (char *)0x0) {
          pcVar7 = (char *)0x0;
        }
        else {
          builtin_strncpy(pcVar7,"    ",5);
          pcVar7 = pcVar7 + 4;
        }
        level = level + -1;
      } while (level != 0);
      iVar8 = iVar8 + iVar3;
    }
    if (pcVar7 != (char *)0x0) {
      pcVar7[0] = ']';
      pcVar7[1] = '\0';
    }
LAB_00179b33:
    iVar8 = iVar8 + 1;
    break;
  case 6:
    if ((value->value).boolean == 0) {
      if (buf != (char *)0x0) {
        builtin_strncpy(buf,"false",6);
        return 5;
      }
      return 5;
    }
    if (buf == (char *)0x0) {
      return 4;
    }
    builtin_strncpy(buf,"true",4);
LAB_001796fd:
    buf[4] = '\0';
    iVar8 = 4;
  }
  return iVar8;
}

Assistant:

static int json_serialize_to_buffer_r(const JSON_Value *value, char *buf, int level, parson_bool_t is_pretty, char *num_buf)
{
    const char *key = NULL, *string = NULL;
    JSON_Value *temp_value = NULL;
    JSON_Array *array = NULL;
    JSON_Object *object = NULL;
    size_t i = 0, count = 0;
    double num = 0.0;
    int written = -1, written_total = 0;
    size_t len = 0;

    switch (json_value_get_type(value)) {
        case JSONArray:
            array = json_value_get_array(value);
            count = json_array_get_count(array);
            APPEND_STRING("[");
            if (count > 0 && is_pretty) {
                APPEND_STRING("\n");
            }
            for (i = 0; i < count; i++) {
                if (is_pretty) {
                    APPEND_INDENT(level+1);
                }
                temp_value = json_array_get_value(array, i);
                written = json_serialize_to_buffer_r(temp_value, buf, level+1, is_pretty, num_buf);
                if (written < 0) {
                    return -1;
                }
                if (buf != NULL) {
                    buf += written;
                }
                written_total += written;
                if (i < (count - 1)) {
                    APPEND_STRING(",");
                }
                if (is_pretty) {
                    APPEND_STRING("\n");
                }
            }
            if (count > 0 && is_pretty) {
                APPEND_INDENT(level);
            }
            APPEND_STRING("]");
            return written_total;
        case JSONObject:
            object = json_value_get_object(value);
            count  = json_object_get_count(object);
            APPEND_STRING("{");
            if (count > 0 && is_pretty) {
                APPEND_STRING("\n");
            }
            for (i = 0; i < count; i++) {
                key = json_object_get_name(object, i);
                if (key == NULL) {
                    return -1;
                }
                if (is_pretty) {
                    APPEND_INDENT(level+1);
                }
                /* We do not support key names with embedded \0 chars */
                written = json_serialize_string(key, strlen(key), buf);
                if (written < 0) {
                    return -1;
                }
                if (buf != NULL) {
                    buf += written;
                }
                written_total += written;
                APPEND_STRING(":");
                if (is_pretty) {
                    APPEND_STRING(" ");
                }
                temp_value = json_object_get_value_at(object, i);
                written = json_serialize_to_buffer_r(temp_value, buf, level+1, is_pretty, num_buf);
                if (written < 0) {
                    return -1;
                }
                if (buf != NULL) {
                    buf += written;
                }
                written_total += written;
                if (i < (count - 1)) {
                    APPEND_STRING(",");
                }
                if (is_pretty) {
                    APPEND_STRING("\n");
                }
            }
            if (count > 0 && is_pretty) {
                APPEND_INDENT(level);
            }
            APPEND_STRING("}");
            return written_total;
        case JSONString:
            string = json_value_get_string(value);
            if (string == NULL) {
                return -1;
            }
            len = json_value_get_string_len(value);
            written = json_serialize_string(string, len, buf);
            if (written < 0) {
                return -1;
            }
            if (buf != NULL) {
                buf += written;
            }
            written_total += written;
            return written_total;
        case JSONBoolean:
            if (json_value_get_boolean(value)) {
                APPEND_STRING("true");
            } else {
                APPEND_STRING("false");
            }
            return written_total;
        case JSONNumber:
            num = json_value_get_number(value);
            if (buf != NULL) {
                num_buf = buf;
            }
            if (parson_number_serialization_function) {
                written = parson_number_serialization_function(num, num_buf);
            } else if (parson_float_format) {
                written = sprintf(num_buf, parson_float_format, num);
            } else {
                written = sprintf(num_buf, PARSON_DEFAULT_FLOAT_FORMAT, num);
            }
            if (written < 0) {
                return -1;
            }
            if (buf != NULL) {
                buf += written;
            }
            written_total += written;
            return written_total;
        case JSONNull:
            APPEND_STRING("null");
            return written_total;
        case JSONError:
            return -1;
        default:
            return -1;
    }
}